

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

void __thiscall
QNetworkRequestFactory::setBearerToken(QNetworkRequestFactory *this,QByteArray *token)

{
  bool bVar1;
  
  bVar1 = ::operator==(&((this->d).d.ptr)->bearerToken,token);
  if (bVar1) {
    return;
  }
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(&this->d);
  QByteArray::operator=(&((this->d).d.ptr)->bearerToken,token);
  return;
}

Assistant:

void QNetworkRequestFactory::setBearerToken(const QByteArray &token)
{
    if (d->bearerToken == token)
        return;

    d.detach();
    d->bearerToken = token;
}